

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::addCore
          (UncoreMinimize *this,Solver *s,LitPair *lits,uint32 cs,weight_t w,bool updateLower)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint32 uVar4;
  Solver *s_00;
  uint *puVar5;
  uint in_ECX;
  long in_RDX;
  Solver *in_RSI;
  UncoreMinimize *in_RDI;
  int in_R8D;
  byte in_R9B;
  weight_t cw;
  weight_t in_stack_00000068;
  Literal p;
  uint32 end;
  uint32 k;
  Core *core;
  Solver *in_stack_00000080;
  UncoreMinimize *in_stack_00000088;
  LitData *x;
  uint32 i;
  undefined4 in_stack_ffffffffffffff38;
  uint32 in_stack_ffffffffffffff3c;
  Solver *in_stack_ffffffffffffff40;
  Solver *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint32 in_stack_ffffffffffffff54;
  Solver *in_stack_ffffffffffffff60;
  Solver *in_stack_ffffffffffffff68;
  undefined1 aux;
  Solver *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  Solver *in_stack_ffffffffffffff80;
  weight_t in_stack_ffffffffffffff90;
  Literal in_stack_ffffffffffffff94;
  Literal in_stack_ffffffffffffff98;
  uint32 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  Literal in_stack_ffffffffffffffa4;
  uint32 in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  Literal in_stack_ffffffffffffffbc;
  LitPair local_40;
  LitData *local_38;
  uint local_30;
  byte local_29;
  int local_28;
  uint local_24;
  long local_20;
  Solver *local_18;
  bool local_1;
  
  local_29 = in_R9B & 1;
  if (local_29 != 0) {
    in_RDI->lower_ = (long)in_R8D + in_RDI->lower_;
  }
  local_30 = 0;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  do {
    if (local_30 == local_24) {
      if (local_24 == 1) {
        local_1 = fixLit(in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff94);
      }
      else {
        switch((uint)in_RDI->options_ >> 3 & 3) {
        default:
          local_1 = addOll((UncoreMinimize *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70,(LitPair *)in_stack_ffffffffffffff68,
                           (uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                           (weight_t)in_stack_ffffffffffffff60);
          break;
        case 1:
          local_1 = addK(in_stack_00000088,in_stack_00000080,core._4_4_,_end,p.rep_,
                         in_stack_00000068);
          break;
        case 2:
          local_1 = addK(in_stack_00000088,in_stack_00000080,core._4_4_,_end,p.rep_,
                         in_stack_00000068);
          break;
        case 3:
          local_1 = addPmr((UncoreMinimize *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (Solver *)
                           CONCAT44(in_stack_ffffffffffffffa4.rep_,in_stack_ffffffffffffffa0),
                           (LitPair *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98.rep_),
                           in_stack_ffffffffffffff94.rep_,in_stack_ffffffffffffff90);
        }
      }
      return local_1;
    }
    local_38 = getData((UncoreMinimize *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    iVar3 = local_38->weight - local_28;
    local_38->weight = iVar3;
    if (iVar3 < 1) {
      *(uint *)&local_38->field_0x4 = *(uint *)&local_38->field_0x4 & 0xbfffffff;
      local_38->weight = 0;
    }
    else if (((*(uint *)&in_RDI->field_0xec >> 0x1d & 1) != 0) &&
            ((*(uint *)&local_38->field_0x4 >> 0x1e & 1) == 0)) {
      *(uint *)&local_38->field_0x4 = *(uint *)&local_38->field_0x4 & 0xbfffffff | 0x40000000;
      in_stack_ffffffffffffff80 = (Solver *)&in_RDI->assume_;
      in_stack_ffffffffffffffbc =
           Literal::operator~((Literal *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      LitPair::LitPair(&local_40,in_stack_ffffffffffffffbc,
                       *(uint32 *)(local_20 + 4 + (ulong)local_30 * 8));
      bk_lib::
      pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>::
      push_back((pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                (LitPair *)in_stack_ffffffffffffff48);
    }
    if ((local_38->weight == 0) && (bVar1 = hasCore(in_RDI,local_38), bVar1)) {
      s_00 = (Solver *)
             getCore((UncoreMinimize *)in_stack_ffffffffffffff40,
                     (LitData *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      WCTemp::start((WCTemp *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      in_stack_ffffffffffffffac = 0;
      in_stack_ffffffffffffffa8 = Core::size((Core *)0x1b379e);
      for (; in_stack_ffffffffffffffac != in_stack_ffffffffffffffa8;
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        in_stack_ffffffffffffff98 =
             Core::at((Core *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
        while( true ) {
          in_stack_ffffffffffffff68 = local_18;
          Literal::var((Literal *)&stack0xffffffffffffffa4);
          bVar2 = Solver::topValue((Solver *)
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                   (Var)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          in_stack_ffffffffffffff78 = (uint)bVar2;
          in_stack_ffffffffffffff70 = local_18;
          Literal::var((Literal *)&stack0xffffffffffffffa4);
          bVar2 = Solver::value(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
          if (in_stack_ffffffffffffff78 != bVar2) {
            uVar4 = Solver::rootLevel(local_18);
            in_stack_ffffffffffffff7c =
                 CONCAT13(in_RDI->eRoot_ < uVar4,(int3)in_stack_ffffffffffffff7c);
          }
          if ((char)(in_stack_ffffffffffffff7c >> 0x18) == '\0') break;
          in_stack_ffffffffffffff54 = Solver::rootLevel(local_18);
          aux = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
          in_stack_ffffffffffffff48 = local_18;
          Literal::var((Literal *)&stack0xffffffffffffffa4);
          uVar4 = Solver::level(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          in_stack_ffffffffffffffa0 = uVar4 - 1;
          std::max<unsigned_int>((uint *)&stack0xffffffffffffffa0,&in_RDI->eRoot_);
          Solver::popRootLevel
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     (LitVec *)in_stack_ffffffffffffff70,(bool)aux);
          in_stack_ffffffffffffff60 = (Solver *)&in_RDI->aTop_;
          in_stack_ffffffffffffff9c = Solver::rootLevel(local_18);
          puVar5 = std::min<unsigned_int>
                             ((uint *)in_stack_ffffffffffffff60,(uint *)&stack0xffffffffffffff9c);
          in_RDI->aTop_ = *puVar5;
        }
        in_stack_ffffffffffffffa4.rep_ = in_stack_ffffffffffffff98.rep_;
        WCTemp::add((WCTemp *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    (Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      }
      in_stack_ffffffffffffff94.rep_ = *(weight_t *)((long)&(s_00->model).ebo_.buf + 4);
      bVar1 = closeCore((UncoreMinimize *)in_stack_ffffffffffffff80,
                        (Solver *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (LitData *)in_stack_ffffffffffffff70,
                        SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
      if ((!bVar1) ||
         (bVar1 = addOllCon((UncoreMinimize *)
                            CONCAT44(in_stack_ffffffffffffffbc.rep_,in_stack_ffffffffffffffb8),s_00,
                            (WCTemp *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa4.rep_), !bVar1)) {
        return false;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool UncoreMinimize::addCore(Solver& s, const LitPair* lits, uint32 cs, weight_t w, bool updateLower) {
	assert(s.decisionLevel() == s.rootLevel());
	assert(w && cs);
	// apply weight and check for subcores
	if (updateLower) { lower_ += w; }
	for (uint32 i = 0; i != cs; ++i) {
		LitData& x = getData(lits[i].id);
		if ( (x.weight -= w) <= 0) {
			x.assume = 0;
			x.weight = 0;
		}
		else if (disj_ && !x.assume) {
			x.assume = 1;
			assume_.push_back(LitPair(~lits[i].lit, lits[i].id));
		}
		if (x.weight == 0 && hasCore(x)) {
			Core& core = getCore(x);
			temp_.start(core.bound + 1);
			for (uint32 k = 0, end = core.size(); k != end; ++k) {
				Literal p = core.at(k);
				while (s.topValue(p.var()) != s.value(p.var()) && s.rootLevel() > eRoot_) {
					s.popRootLevel(s.rootLevel() - std::max(s.level(p.var())-1, eRoot_));
					aTop_ = std::min(aTop_, s.rootLevel());
				}
				temp_.add(s, p);
			}
			weight_t cw = core.weight;
			if (!closeCore(s, x, temp_.bound <= 1) || !addOllCon(s, temp_, cw)) {
				return false;
			}
		}
	}
	if (cs == 1) {
		return fixLit(s, lits[0].lit);
	}
	// add new core
	switch (options_.algo) {
		default:
		case OptParams::usc_oll: return addOll(s, lits, cs, w);
		case OptParams::usc_one: return addK(s, cs, lits, cs, w);
		case OptParams::usc_k:   return addK(s, options_.kLim, lits, cs, w);
		case OptParams::usc_pmr: return addPmr(s, lits, cs, w);
	}
}